

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

bool __thiscall helics::TimeCoordinator::updateTimeFactors(TimeCoordinator *this)

{
  TimeDependencies *dependencies;
  long lVar1;
  long lVar2;
  Time TVar3;
  Time TVar4;
  long lVar5;
  long lVar6;
  TimeData *pTVar7;
  TimeData *pTVar8;
  long lVar9;
  bool bVar10;
  byte bVar11;
  TimeData local_70;
  
  bVar11 = 0;
  dependencies = &(this->super_BaseTimeCoordinator).dependencies;
  generateMinTimeTotal
            (&local_70,dependencies,
             (bool)((this->globalTime | (this->info).restrictive_time_policy) & 1),
             (GlobalFederateId)0x8831d580,(GlobalFederateId)0x8831d580,
             (this->super_BaseTimeCoordinator).sequenceCounter);
  pTVar7 = &local_70;
  pTVar8 = &this->total;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pTVar8->next).internalTimeCode = (pTVar7->next).internalTimeCode;
    pTVar7 = (TimeData *)((long)pTVar7 + (ulong)bVar11 * -0x10 + 8);
    pTVar8 = (TimeData *)((long)pTVar8 + (ulong)bVar11 * -0x10 + 8);
  }
  generateMinTimeUpstream
            (&local_70,dependencies,
             (bool)((this->globalTime | (this->info).restrictive_time_policy) & 1),
             (GlobalFederateId)0x8831d580,(GlobalFederateId)0x8831d580,
             (this->super_BaseTimeCoordinator).sequenceCounter);
  pTVar7 = &local_70;
  pTVar8 = &this->upstream;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pTVar8->next).internalTimeCode = (pTVar7->next).internalTimeCode;
    pTVar7 = (TimeData *)((long)pTVar7 + (ulong)bVar11 * -0x10 + 8);
    pTVar8 = (TimeData *)((long)pTVar8 + (ulong)bVar11 * -0x10 + 8);
  }
  if ((this->globalTime == true) &&
     ((long)(this->super_BaseTimeCoordinator).dependencies.dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->super_BaseTimeCoordinator).dependencies.dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x58)) {
    pTVar7 = &this->total;
    pTVar8 = &this->upstream;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pTVar8->next).internalTimeCode = (pTVar7->next).internalTimeCode;
      pTVar7 = (TimeData *)((long)pTVar7 + (ulong)bVar11 * -0x10 + 8);
      pTVar8 = (TimeData *)((long)pTVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    (this->upstream).minFed.gid = -2010000000;
  }
  lVar5 = (this->info).period.internalTimeCode;
  lVar6 = (this->info).timeDelta.internalTimeCode;
  if (lVar6 < lVar5) {
    lVar6 = lVar5;
  }
  (this->maxTime).internalTimeCode =
       0x7fffffffffffffff - (lVar6 + (this->info).outputDelay.internalTimeCode);
  lVar5 = (this->time_next).internalTimeCode;
  (this->time_minminDe).internalTimeCode = (this->total).minDe.internalTimeCode;
  updateNextPossibleEventTime(this);
  lVar6 = (this->time_next).internalTimeCode;
  TVar3.internalTimeCode = (this->total).minDe.internalTimeCode;
  lVar1 = (this->maxTime).internalTimeCode;
  if (TVar3.internalTimeCode < lVar1) {
    TVar3 = generateAllowedTime(this,TVar3);
    TVar3.internalTimeCode = TVar3.internalTimeCode + (this->info).outputDelay.internalTimeCode;
    (this->total).minDe.internalTimeCode = TVar3.internalTimeCode;
  }
  TVar4.internalTimeCode = (this->upstream).minDe.internalTimeCode;
  if ((TVar4.internalTimeCode < lVar1) && (TVar3.internalTimeCode < TVar4.internalTimeCode)) {
    TVar4 = generateAllowedTime(this,TVar4);
    TVar4.internalTimeCode = TVar4.internalTimeCode + (this->info).outputDelay.internalTimeCode;
    (this->upstream).minDe.internalTimeCode = TVar4.internalTimeCode;
  }
  if ((this->globalTime == false) &&
     ((((this->info).event_triggered != false ||
       ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)) &&
      ((this->upstream).Te.internalTimeCode < lVar1)))) {
    TVar4 = generateAllowedTime(this,TVar4);
    (this->upstream).Te.internalTimeCode = TVar4.internalTimeCode;
  }
  bVar10 = TVar3.internalTimeCode != (this->time_minDe).internalTimeCode;
  if (bVar10) {
    (this->time_minDe).internalTimeCode = TVar3.internalTimeCode;
  }
  lVar2 = (this->total).next.internalTimeCode;
  lVar9 = 0x7fffffffffffffff;
  if (lVar2 < lVar1) {
    lVar9 = (this->info).inputDelay.internalTimeCode + lVar2;
  }
  (this->time_allow).internalTimeCode = lVar9;
  updateNextExecutionTime(this);
  return bVar10 || lVar5 != lVar6;
}

Assistant:

bool TimeCoordinator::updateTimeFactors()
{
    total = generateMinTimeTotal(dependencies,
                                 info.restrictive_time_policy || globalTime,
                                 GlobalFederateId{},
                                 NoIgnoredFederates,
                                 sequenceCounter);
    upstream = generateMinTimeUpstream(dependencies,
                                       info.restrictive_time_policy || globalTime,
                                       GlobalFederateId{},
                                       NoIgnoredFederates,
                                       sequenceCounter);
    if (globalTime && dependencies.size() == 1) {
        upstream = total;
        upstream.minFed = GlobalFederateId{};
    }

    maxTime = Time::maxVal() - info.outputDelay - (std::max)(info.period, info.timeDelta);
    bool update = false;
    time_minminDe = total.minDe;
    Time prev_next = time_next;
    updateNextPossibleEventTime();

    //    printf("%d UPDATE next=%f, minminDE=%f, Tdemin=%f\n", source_id,
    //    static_cast<double>(time_next),
    // static_cast<double>(minminDe), static_cast<double>(minDe));
    if (prev_next != time_next) {
        update = true;
    }
    if (total.minDe < maxTime) {
        total.minDe = generateAllowedTime(total.minDe) + info.outputDelay;
    }
    if (upstream.minDe < maxTime && upstream.minDe > total.minDe) {
        upstream.minDe = generateAllowedTime(upstream.minDe) + info.outputDelay;
    }
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        if (upstream.Te < maxTime) {
            upstream.Te = generateAllowedTime(upstream.minDe);
        }
    }
    if (total.minDe != time_minDe) {
        update = true;
        time_minDe = total.minDe;
    }
    time_allow = (total.next < maxTime) ? info.inputDelay + total.next : Time::maxVal();

    updateNextExecutionTime();
    return update;
}